

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printToFile(queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *cl)

{
  int iVar1;
  Node *pNVar2;
  int *piVar3;
  ostream *poVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  ostream local_240 [8];
  ofstream Nodes;
  int local_34;
  
  std::ofstream::ofstream(local_240);
  std::ofstream::open((char *)local_240,0x106016);
  std::deque<Node_*,_std::allocator<Node_*>_>::pop_front(&cl->c);
  local_34 = 1;
  while ((cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur !=
         (cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur) {
    std::endl<char,std::char_traits<char>>(local_240);
    poVar4 = std::operator<<(local_240,"Node number: ");
    std::ostream::operator<<(poVar4,local_34);
    pNVar2 = *(cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    piVar5 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar6 = 0;
    uVar7 = 0;
    while( true ) {
      if (piVar5 == piVar3) break;
      iVar1 = *piVar5;
      if (uVar7 % 3 == 0) {
        std::endl<char,std::char_traits<char>>(local_240);
      }
      poVar4 = (ostream *)std::ostream::operator<<(local_240,iVar1);
      std::operator<<(poVar4,' ');
      uVar7 = uVar7 + 1;
      piVar5 = piVar5 + 1;
      iVar6 = iVar6 + -1;
    }
    std::endl<char,std::char_traits<char>>(local_240);
    std::operator<<(local_240,"Parent: ");
    pNVar2 = (*(cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur)->parent;
    piVar5 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      if (piVar5 == piVar3) break;
      iVar1 = *piVar5;
      if ((uVar7 / 3) * 3 + iVar6 == 0) {
        std::endl<char,std::char_traits<char>>(local_240);
      }
      poVar4 = (ostream *)std::ostream::operator<<(local_240,iVar1);
      std::operator<<(poVar4,' ');
      uVar7 = uVar7 + 1;
      piVar5 = piVar5 + 1;
      iVar6 = iVar6 + -1;
    }
    std::deque<Node_*,_std::allocator<Node_*>_>::pop_front(&cl->c);
    local_34 = local_34 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_240);
  return;
}

Assistant:

void printToFile(std::queue<Node*> cl) {
  ofstream Nodes;
  Nodes.open("Nodes.txt");
  cl.pop();
  int nodeCount = 1;
  while (!cl.empty()) {
    int count = 0;
    Nodes << std::endl;
    Nodes << "Node number: " << nodeCount;
    for (auto i : cl.front()->puzzle) {
      if (count % 3 == 0)
        Nodes << std::endl;
      Nodes << i << ' ';
      count++;
    }
    Nodes << std::endl;
    Nodes << "Parent: ";
    for (auto i : cl.front()->parent->puzzle) {
      if (count % 3 == 0)
        Nodes << std::endl;
      Nodes << i << ' ';
      count++;
    }
    cl.pop();
    nodeCount++;
  }
  Nodes.close();
  }